

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp.c
# Opt level: O2

char * lejp_error_to_string(int e)

{
  uint uVar1;
  
  uVar1 = 0;
  if (e < 1) {
    uVar1 = -e;
  }
  if (0x17 < (int)uVar1) {
    return "Unknown error";
  }
  return parser_errs_rel + *(int *)(parser_errs_rel + (ulong)uVar1 * 4);
}

Assistant:

const char *
lejp_error_to_string(int e)
{
	if (e > 0)
		e = 0;
	else
		e = -e;

	if (e >= (int)LWS_ARRAY_SIZE(parser_errs))
		return "Unknown error";

	return parser_errs[e];
}